

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall Bounds2_IteratorDegenerate_Test::TestBody(Bounds2_IteratorDegenerate_Test *this)

{
  char *in_R9;
  Bounds2iIterator BVar1;
  Point2i p_2;
  AssertHelper local_80;
  Point2i p_1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  string local_60;
  Bounds2i b3;
  Bounds2i b2;
  Bounds2i b;
  
  b.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  b.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
  b.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
  b.pMax.super_Tuple2<pbrt::Point2,_int>.y = 10;
  BVar1 = pbrt::end(&b);
  if (BVar1.bounds != &b ||
      ((Tuple2<pbrt::Point2,_int>)BVar1.p.super_Tuple2<pbrt::Point2,_int>).
      super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)0x0) {
    b3.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
    b3.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
    b2.pMin.super_Tuple2<pbrt::Point2,_int> =
         b2.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffffffffff00;
    b2.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
    b2.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
    testing::Message::Message((Message *)&p_1);
    std::operator<<((ostream *)((long)p_1.super_Tuple2<pbrt::Point2,_int> + 0x10),"p = ");
    pbrt::operator<<((ostream *)((long)p_1.super_Tuple2<pbrt::Point2,_int> + 0x10),&b3.pMin);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&b2,(AssertionResult *)"reached","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0xd0,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p_2,(Message *)&p_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_2);
    std::__cxx11::string::~string((string *)&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&p_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&b2.pMax);
  }
  b2.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  b2.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
  b2.pMax.super_Tuple2<pbrt::Point2,_int>.x = 4;
  b2.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
  BVar1 = pbrt::end(&b2);
  if (BVar1.bounds != &b2 ||
      ((Tuple2<pbrt::Point2,_int>)BVar1.p.super_Tuple2<pbrt::Point2,_int>).
      super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)0x0) {
    p_1.super_Tuple2<pbrt::Point2,_int>.x = 0;
    p_1.super_Tuple2<pbrt::Point2,_int>.y = 0;
    b3.pMin.super_Tuple2<pbrt::Point2,_int> =
         b3.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffffffffff00;
    b3.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
    b3.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
    testing::Message::Message((Message *)&p_2);
    std::operator<<((ostream *)((long)p_2.super_Tuple2<pbrt::Point2,_int> + 0x10),"p = ");
    pbrt::operator<<((ostream *)((long)p_2.super_Tuple2<pbrt::Point2,_int> + 0x10),&p_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&b3,(AssertionResult *)"reached","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0xd8,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&p_2);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&p_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&b3.pMax);
  }
  b3.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0x7fffffff;
  b3.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x7fffffff;
  b3.pMax.super_Tuple2<pbrt::Point2,_int>.x = -0x80000000;
  b3.pMax.super_Tuple2<pbrt::Point2,_int>.y = -0x80000000;
  BVar1 = pbrt::end(&b3);
  if (BVar1.bounds != &b3 ||
      ((Tuple2<pbrt::Point2,_int>)BVar1.p.super_Tuple2<pbrt::Point2,_int>).
      super_Tuple2<pbrt::Point2,_int> != (Tuple2<pbrt::Point2,_int>)0x7fffffff7fffffff) {
    p_2.super_Tuple2<pbrt::Point2,_int>.x = 0x7fffffff;
    p_2.super_Tuple2<pbrt::Point2,_int>.y = 0x7fffffff;
    p_1.super_Tuple2<pbrt::Point2,_int> = p_1.super_Tuple2<pbrt::Point2,_int> & 0xffffffffffffff00;
    local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)&(local_80.data_)->line,"p = ");
    pbrt::operator<<((ostream *)&(local_80.data_)->line,&p_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&p_1,(AssertionResult *)"reached","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/vecmath_test.cpp"
               ,0xe0,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_70);
  }
  return;
}

Assistant:

TEST(Bounds2, IteratorDegenerate) {
    Bounds2i b{{0, 0}, {0, 10}};
    for (auto p : b) {
        // This loop should never run.
        bool reached = true;
        EXPECT_FALSE(reached) << "p = " << p;
        break;
    }

    Bounds2i b2{{0, 0}, {4, 0}};
    for (auto p : b2) {
        // This loop should never run.
        bool reached = true;
        EXPECT_FALSE(reached) << "p = " << p;
        break;
    }

    Bounds2i b3;
    for (auto p : b3) {
        // This loop should never run.
        bool reached = true;
        EXPECT_FALSE(reached) << "p = " << p;
        break;
    }
}